

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# naive_vector_column.h
# Opt level: O3

bool __thiscall
Gudhi::persistence_matrix::
Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
::
_add<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>>
          (Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>
           *this,Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                 *column)

{
  storage_type *psVar1;
  ID_index IVar2;
  size_type new_size;
  stored_size_type sVar3;
  bool bVar4;
  ulong uVar5;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
  *__v;
  _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
  *this_00;
  long lVar6;
  pointer ppEVar7;
  Column_support newColumn;
  anon_class_1_0_00000001 local_b9;
  anon_class_8_1_d68037b6 local_b8;
  anon_class_8_1_d68037b6 local_b0;
  Column_support local_a8;
  anon_class_16_2_26534583 local_50;
  anon_class_16_2_90bf7f7f local_40;
  
  new_size = (column->column_).
             super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
             .super_type.m_holder.m_size;
  if (new_size == 0) {
    bVar4 = false;
  }
  else if (*(long *)(this + 0x18) == 0) {
    boost::container::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
    ::priv_resize<boost::container::value_init_t>
              ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                *)(this + 0x10),new_size,(value_init_t *)&boost::container::value_init);
    sVar3 = (column->column_).
            super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
            .super_type.m_holder.m_size;
    bVar4 = true;
    if (sVar3 != 0) {
      ppEVar7 = (column->column_).
                super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                .super_type.m_holder.m_start;
      lVar6 = sVar3 << 3;
      uVar5 = 0;
      do {
        if (ppEVar7 == (pointer)0x0) {
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                        "reference boost::container::vec_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, true>::operator*() const [Pointer = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> **, IsConst = true]"
                       );
        }
        IVar2 = (*ppEVar7)->rowIndex_;
        __v = (Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
               *)operator_new(8);
        (__v->super_Entry_column_index_option).columnIndex_ = *(uint *)this;
        __v->rowIndex_ = IVar2;
        if (*(ulong *)(this + 0x18) <= uVar5) {
          __assert_fail("this->m_holder.m_size > n","/usr/include/boost/container/vector.hpp",0x644,
                        "reference boost::container::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::new_allocator<void>, void>>::operator[](size_type) [T = Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, A = boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true, Gudhi::persistence_matrix::Column_types::SMALL_VECTOR, true, true, false>>> *, boost::container::new_allocator<void>, void>, Options = void]"
                       );
        }
        *(Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>
          **)(*(long *)(this + 0x10) + uVar5 * 8) = __v;
        local_a8.
        super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
        .super_type.m_holder.m_start =
             (pointer)CONCAT44(local_a8.
                               super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                               .super_type.m_holder.m_start._4_4_,IVar2);
        if (*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
              **)(this + 8) !=
            (map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
             *)0x0) {
          this_00 = (_Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
                     *)std::
                       map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
                       ::operator[](*(map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_>_>_>_>_>
                                      **)(this + 8),(key_type *)&local_a8);
          std::
          _Rb_tree<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>,std::_Identity<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>>>
          ::
          _M_insert_unique<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>const&>
                    (this_00,__v);
        }
        ppEVar7 = ppEVar7 + 1;
        uVar5 = (ulong)((int)uVar5 + 1);
        lVar6 = lVar6 + -8;
      } while (lVar6 != 0);
      bVar4 = true;
    }
  }
  else {
    psVar1 = &local_a8.
              super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
              .m_storage_start;
    local_a8.
    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
    .super_type.m_holder.m_size = 0;
    local_a8.
    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
    .super_type.m_holder.m_capacity = 8;
    uVar5 = *(long *)(this + 0x18) + new_size;
    local_a8.
    super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
    .super_type.m_holder.m_start = (pointer)psVar1;
    if (8 < uVar5) {
      boost::container::
      vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
      ::priv_reserve_no_capacity
                ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_boost::container::new_allocator<void>,_void>,_void>
                  *)&local_a8,uVar5);
    }
    local_b8.newColumn = &local_a8;
    local_b0.newColumn = local_b8.newColumn;
    local_50.this =
         (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
          *)this;
    local_50.newColumn = local_b8.newColumn;
    local_40.newColumn = local_b8.newColumn;
    local_40.this =
         (Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
          *)this;
    bVar4 = _generic_add_to_column<Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,8ul,void,void>>,Gudhi::persistence_matrix::Naive_vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>,boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,fals___x<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>**,false>&)_1_>
                      (column,(Naive_vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>,_boost::container::small_vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_8UL,_void,_void>_>
                               *)this,&local_b0,&local_40,&local_b9,&local_b8,&local_50);
    boost::container::
    vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::new_allocator<void>,void>,void>
    ::
    priv_swap<boost::container::vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::new_allocator<void>,void>,void>>
              ((vector<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::small_vector_allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)5,true,true,false>>>*,boost::container::new_allocator<void>,void>,void>
                *)(this + 0x10),&local_a8);
    if ((local_a8.
         super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
         .super_type.m_holder.m_capacity != 0) &&
       (psVar1 != (storage_type *)
                  local_a8.
                  super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                  .super_type.m_holder.m_start)) {
      operator_delete(local_a8.
                      super_small_vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)5,_true,_true,_false>_>_>_*,_void,_void>
                      .super_type.m_holder.m_start);
    }
  }
  return bVar4;
}

Assistant:

inline bool Naive_vector_column<Master_matrix,Support>::_add(const Entry_range& column)
{
  if (column.begin() == column.end()) return false;
  if (column_.empty()) {  // chain should never enter here.
    column_.resize(column.size());
    Index i = 0;
    for (const Entry& entry : column) {
      if constexpr (Master_matrix::Option_list::is_z2) {
        _update_entry(entry.get_row_index(), i++);
      } else {
        _update_entry(entry.get_element(), entry.get_row_index(), i++);
      }
    }
    return true;
  }

  Column_support newColumn;
  newColumn.reserve(column_.size() + column.size());  // safe upper bound

  auto pivotIsZeroed = _generic_add_to_column(
      column,
      *this,
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Entry_range::const_iterator& itSource,
          [[maybe_unused]] const typename Column_support::iterator& itTarget) {
        if constexpr (Master_matrix::Option_list::is_z2) {
          _insert_entry(itSource->get_row_index(), newColumn);
        } else {
          _insert_entry(itSource->get_element(), itSource->get_row_index(), newColumn);
        }
      },
      [&](Field_element& targetElement, typename Entry_range::const_iterator& itSource) {
        if constexpr (!Master_matrix::Option_list::is_z2)
          operators_->add_inplace(targetElement, itSource->get_element());
      },
      [&](Entry* entryTarget) { newColumn.push_back(entryTarget); },
      [&](typename Column_support::iterator& itTarget) {
        while (itTarget != column_.end()) {
          newColumn.push_back(*itTarget);
          itTarget++;
        }
      });

  column_.swap(newColumn);

  return pivotIsZeroed;
}